

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O0

void __thiscall PathTracer::create_descriptor(PathTracer *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  initializer_list<VkDescriptorSetLayoutBinding> __l_01;
  element_type *this_00;
  pointer in_RSI;
  allocator_type *in_RDI;
  VkSampler immutable_samplers [1];
  VkDescriptorSetLayoutBinding noise_binding;
  VkDescriptorSetLayoutBinding normal_binding;
  VkDescriptorSetLayoutBinding albedo_binding;
  VkDescriptorSetLayoutBinding color_binding;
  shared_ptr<myvk::DescriptorPool> *in_stack_fffffffffffffdc8;
  shared_ptr<myvk::DescriptorSet> *__r;
  shared_ptr<myvk::DescriptorPool> *in_stack_fffffffffffffdd0;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *this_01;
  iterator device_00;
  size_type in_stack_fffffffffffffe10;
  uint32_t in_stack_fffffffffffffe28;
  uint32_t in_stack_fffffffffffffe2c;
  Ptr<ImageView> *in_stack_fffffffffffffe30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> sampler;
  vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
  *in_stack_fffffffffffffe40;
  DescriptorSet *this_02;
  Ptr<Device> *in_stack_fffffffffffffe48;
  Ptr<Device> *device_01;
  Ptr<DescriptorSetLayout> *in_stack_fffffffffffffe80;
  Ptr<DescriptorPool> *in_stack_fffffffffffffe88;
  Ptr<Device> local_170;
  DescriptorSet *pDStack_160;
  Ptr<Device> *local_158;
  allocator<VkDescriptorSetLayoutBinding> local_149;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  shared_ptr<myvk::DescriptorSet> local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_59 [25];
  undefined8 local_40;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> local_20;
  
  local_59._1_4_ = 3;
  local_59._5_4_ = 3;
  local_59._9_4_ = 1;
  local_59._13_4_ = 1;
  local_59._17_8_ = local_59 + 1;
  local_40 = 2;
  device_00 = (iterator)local_59;
  local_20.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RSI;
  std::allocator<VkDescriptorPoolSize>::allocator((allocator<VkDescriptorPoolSize> *)0x16eb8b);
  __l._M_len = in_stack_fffffffffffffe10;
  __l._M_array = (iterator)device_00;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)in_RSI,__l,
             in_RDI);
  myvk::DescriptorPool::Create
            ((Ptr<Device> *)device_00,(uint32_t)((ulong)in_RSI >> 0x20),
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)in_RDI);
  this_01 = &local_20;
  std::shared_ptr<myvk::DescriptorPool>::operator=
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::shared_ptr<myvk::DescriptorPool>::~shared_ptr((shared_ptr<myvk::DescriptorPool> *)0x16ebf8);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~vector(this_01);
  std::allocator<VkDescriptorPoolSize>::~allocator((allocator<VkDescriptorPoolSize> *)local_59);
  local_78 = 0;
  local_88 = 0x300000000;
  uStack_80 = 0x3000000001;
  local_98 = 0;
  local_a8 = 0x300000001;
  uStack_a0 = 0x3000000001;
  local_b8 = 0;
  local_c8 = 0x300000002;
  uStack_c0 = 0x3000000001;
  local_138 = 0;
  local_148 = 0x300000000;
  uStack_140 = 0x3000000001;
  local_120 = 0;
  local_130 = 0x300000001;
  uStack_128 = 0x3000000001;
  local_108 = 0;
  local_118 = 0x300000002;
  uStack_110 = 0x3000000001;
  local_100 = &local_148;
  local_f8 = 3;
  std::allocator<VkDescriptorSetLayoutBinding>::allocator
            ((allocator<VkDescriptorSetLayoutBinding> *)0x16ed70);
  __l_00._M_len = in_stack_fffffffffffffe10;
  __l_00._M_array = device_00;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             in_RSI,__l_00,(allocator_type *)in_RDI);
  myvk::DescriptorSetLayout::Create(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  __r = &local_d8;
  std::shared_ptr<myvk::DescriptorSetLayout>::operator=
            ((shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffdd0,
             (shared_ptr<myvk::DescriptorSetLayout> *)__r);
  std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)0x16edd6);
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::~vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             this_01);
  std::allocator<VkDescriptorSetLayoutBinding>::~allocator(&local_149);
  local_158 = (Ptr<Device> *)0x0;
  local_170.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000000;
  pDStack_160 = (DescriptorSet *)0x2000000001;
  this_00 = std::__shared_ptr_access<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16ee44);
  local_170.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)myvk::Sampler::GetHandle(this_00);
  device_01 = &local_170;
  sampler._M_pi =
       local_170.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_02 = pDStack_160;
  local_158 = device_01;
  std::allocator<VkDescriptorSetLayoutBinding>::allocator
            ((allocator<VkDescriptorSetLayoutBinding> *)0x16eeb6);
  __l_01._M_len = in_stack_fffffffffffffe10;
  __l_01._M_array = device_00;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             in_RSI,__l_01,(allocator_type *)in_RDI);
  myvk::DescriptorSetLayout::Create
            (device_01,
             (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             this_02);
  std::shared_ptr<myvk::DescriptorSetLayout>::operator=
            ((shared_ptr<myvk::DescriptorSetLayout> *)
             local_20.
             super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(shared_ptr<myvk::DescriptorSetLayout> *)__r
            );
  std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)0x16ef1c);
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::~vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             this_01);
  std::allocator<VkDescriptorSetLayoutBinding>::~allocator
            ((allocator<VkDescriptorSetLayoutBinding> *)&stack0xfffffffffffffe37);
  myvk::DescriptorSet::Create(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::shared_ptr<myvk::DescriptorSet>::operator=
            ((shared_ptr<myvk::DescriptorSet> *)
             local_20.
             super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,__r);
  std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x16ef73);
  myvk::DescriptorSet::Create(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::shared_ptr<myvk::DescriptorSet>::operator=
            ((shared_ptr<myvk::DescriptorSet> *)
             local_20.
             super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,__r);
  std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x16efb3);
  std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16efc4);
  myvk::DescriptorSet::UpdateCombinedImageSampler
            (this_02,(Ptr<Sampler> *)sampler._M_pi,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
  return;
}

Assistant:

void PathTracer::create_descriptor(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(
	    device, 2, {{VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 3}, {VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 1}});
	{
		VkDescriptorSetLayoutBinding color_binding = {};
		color_binding.binding = 0;
		color_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
		color_binding.descriptorCount = 1;
		color_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

		VkDescriptorSetLayoutBinding albedo_binding = {};
		albedo_binding.binding = 1;
		albedo_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
		albedo_binding.descriptorCount = 1;
		albedo_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

		VkDescriptorSetLayoutBinding normal_binding = {};
		normal_binding.binding = 2;
		normal_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
		normal_binding.descriptorCount = 1;
		normal_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

		m_target_descriptor_set_layout =
		    myvk::DescriptorSetLayout::Create(device, {color_binding, albedo_binding, normal_binding});
	}

	{
		VkDescriptorSetLayoutBinding noise_binding = {};
		noise_binding.binding = 0;
		noise_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		noise_binding.descriptorCount = 1;
		noise_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;
		VkSampler immutable_samplers[] = {m_noise_sampler->GetHandle()};
		noise_binding.pImmutableSamplers = immutable_samplers;

		m_noise_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {noise_binding});
	}
	m_target_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_target_descriptor_set_layout);

	m_noise_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_noise_descriptor_set_layout);
	m_noise_descriptor_set->UpdateCombinedImageSampler(m_noise_sampler, m_noise_image_view, 0);
}